

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_form_edge_split
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_INT *pRVar3;
  REF_CELL pRVar4;
  REF_ADJ pRVar5;
  REF_INT *pRVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  REF_INT RVar10;
  REF_STATUS RVar11;
  REF_ADJ_ITEM pRVar12;
  int iVar13;
  undefined8 uVar14;
  REF_INT RVar15;
  long lVar16;
  REF_INT RVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  int local_9c;
  ulong local_98;
  int local_80;
  REF_INT seg_nodes [3];
  REF_BOOL all_local;
  REF_INT local_64;
  long local_60;
  long local_58;
  REF_INT face_nodes [3];
  REF_BOOL already_have_it;
  REF_BOOL has_triangle;
  ulong local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = new_node;
  pRVar3 = ref_node->part;
  iVar13 = ref_node->ref_mpi->id;
  local_58 = (long)node0;
  if (((iVar13 == pRVar3[local_58]) && (iVar13 == pRVar3[node1])) && (iVar13 == pRVar3[new_node])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cavity->split_node0 = node0;
      ref_cavity->split_node1 = node1;
      pRVar4 = ref_grid->cell[8];
      local_98 = 0xffffffff;
      RVar17 = -1;
      local_64 = new_node;
      if (-1 < node0) {
        pRVar5 = pRVar4->ref_adj;
        local_98 = 0xffffffff;
        RVar17 = -1;
        if (node0 < pRVar5->nnode) {
          uVar9 = pRVar5->first[local_58];
          local_98 = 0xffffffff;
          RVar17 = -1;
          if ((long)(int)uVar9 != -1) {
            RVar17 = pRVar5->item[(int)uVar9].ref;
            local_98 = (ulong)uVar9;
          }
        }
      }
      while ((int)local_98 != -1) {
        local_60 = (long)RVar17;
        for (iVar13 = 0; iVar13 < pRVar4->node_per; iVar13 = iVar13 + 1) {
          if (pRVar4->c2n[pRVar4->size_per * RVar17 + iVar13] == node1) {
            uVar9 = ref_list_contains(ref_cavity->tet_list,RVar17,&already_have_it);
            if (uVar9 != 0) {
              pcVar19 = "have tet?";
              uVar14 = 0x589;
              goto LAB_001a3ce0;
            }
            if (already_have_it != 0) {
              pcVar19 = "added tet twice?";
              uVar14 = 0x58a;
              goto LAB_001a3d36;
            }
            uVar9 = ref_list_push(ref_cavity->tet_list,RVar17);
            if (uVar9 != 0) {
              pcVar19 = "save tet";
              uVar14 = 0x58b;
              goto LAB_001a3ce0;
            }
            uVar9 = ref_cell_all_local(pRVar4,ref_node,RVar17,&all_local);
            if (uVar9 != 0) {
              pcVar19 = "local cell";
              uVar14 = 0x58c;
              goto LAB_001a3ce0;
            }
            if (all_local == 0) goto LAB_001a3f84;
            for (lVar20 = 0; lVar20 < pRVar4->face_per; lVar20 = lVar20 + 1) {
              pRVar3 = pRVar4->c2n;
              iVar1 = pRVar4->size_per;
              pRVar6 = pRVar4->f2n;
              for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                face_nodes[lVar16] =
                     pRVar3[(long)pRVar6[(ulong)((uint)lVar20 & 0x3fffffff) * 4 + lVar16] +
                            iVar1 * local_60];
              }
              if (((face_nodes[1] != node0 && face_nodes[0] != node0) && face_nodes[2] != node0 ||
                   (face_nodes[1] != node1 && face_nodes[0] != node1) && face_nodes[2] != node1) &&
                 (uVar9 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar9 != 0)) {
                pcVar19 = "tet side";
                uVar14 = 0x59b;
                goto LAB_001a3ce0;
              }
            }
          }
        }
        pRVar12 = pRVar4->ref_adj->item;
        local_98 = (ulong)pRVar12[(int)local_98].next;
        RVar17 = -1;
        if (local_98 != 0xffffffffffffffff) {
          RVar17 = pRVar12[local_98].ref;
        }
      }
      pRVar4 = ref_grid->cell[3];
      uVar9 = ref_cell_has_side(pRVar4,node0,node1,&has_triangle);
      if (uVar9 == 0) {
        if (has_triangle != 0) {
          local_38 = 0xffffffff;
          RVar17 = -1;
          if (-1 < node0) {
            pRVar5 = pRVar4->ref_adj;
            local_38 = 0xffffffff;
            RVar17 = -1;
            if (node0 < pRVar5->nnode) {
              uVar9 = pRVar5->first[local_58];
              local_38 = 0xffffffff;
              RVar17 = -1;
              if ((long)(int)uVar9 != -1) {
                RVar17 = pRVar5->item[(int)uVar9].ref;
                local_38 = (ulong)uVar9;
              }
            }
          }
          RVar15 = node1;
          if (node0 < node1) {
            RVar15 = node0;
          }
          RVar10 = node1;
          if (node1 < node0) {
            RVar10 = node0;
          }
          local_60 = CONCAT44(local_60._4_4_,RVar10);
          while ((int)local_38 != -1) {
            for (iVar13 = 0; iVar13 < pRVar4->node_per; iVar13 = iVar13 + 1) {
              if (pRVar4->c2n[pRVar4->size_per * RVar17 + iVar13] == node1) {
                uVar9 = ref_list_push(ref_cavity->tri_list,RVar17);
                if (uVar9 != 0) {
                  pcVar19 = "save tri";
                  uVar14 = 0x5a5;
                  goto LAB_001a3ce0;
                }
                uVar9 = ref_cell_all_local(pRVar4,ref_node,RVar17,&all_local);
                if (uVar9 != 0) {
                  pcVar19 = "local cell";
                  uVar14 = 0x5a7;
                  goto LAB_001a3ce0;
                }
                if (all_local == 0) goto LAB_001a3f84;
                for (lVar20 = 0; lVar20 < pRVar4->edge_per; lVar20 = lVar20 + 1) {
                  pRVar3 = pRVar4->c2n;
                  lVar16 = (long)pRVar4->size_per * (long)RVar17;
                  lVar18 = (long)(int)lVar16;
                  iVar1 = pRVar3[pRVar4->e2n[lVar20 * 2] + lVar18];
                  iVar2 = pRVar3[pRVar4->e2n[lVar20 * 2 + 1] + lVar18];
                  iVar7 = iVar2;
                  if (iVar1 < iVar2) {
                    iVar7 = iVar1;
                  }
                  iVar8 = iVar2;
                  if (iVar2 < iVar1) {
                    iVar8 = iVar1;
                  }
                  if ((RVar15 != iVar7) || ((int)local_60 != iVar8)) {
                    seg_nodes[2] = pRVar3[lVar16 + 3];
                    seg_nodes[0] = iVar1;
                    seg_nodes[1] = iVar2;
                    uVar9 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
                    if (uVar9 != 0) {
                      pcVar19 = "tri side";
                      uVar14 = 0x5b6;
                      goto LAB_001a3ce0;
                    }
                  }
                }
              }
            }
            pRVar12 = pRVar4->ref_adj->item;
            local_38 = (ulong)pRVar12[(int)local_38].next;
            RVar17 = -1;
            if (local_38 != 0xffffffffffffffff) {
              RVar17 = pRVar12[local_38].ref;
            }
          }
          iVar13 = ref_cavity->tri_list->n;
          if (1 < iVar13 - 1U) {
            pcVar19 = "expect one or two tri";
            uVar14 = 0x5bc;
LAB_001a3d36:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar14,"ref_cavity_form_edge_split",pcVar19);
            return 1;
          }
          if (iVar13 == 1) {
            local_80 = -1;
            iVar13 = -1;
            if (node0 < 0) goto LAB_001a408b;
            pRVar5 = pRVar4->ref_adj;
            local_80 = -1;
            iVar13 = -1;
            if (pRVar5->nnode <= node0) goto LAB_001a408b;
            iVar1 = pRVar5->first[local_58];
            local_80 = -1;
            iVar13 = -1;
            if (iVar1 == -1) goto LAB_001a408b;
            pRVar12 = pRVar5->item;
            do {
              local_80 = pRVar12[iVar1].ref;
              iVar13 = iVar1;
LAB_001a408b:
              do {
                if (iVar13 == -1) goto LAB_001a41d9;
                for (local_9c = 0; local_9c < pRVar4->node_per; local_9c = local_9c + 1) {
                  if (pRVar4->c2n[pRVar4->size_per * local_80 + local_9c] == node1) {
                    for (lVar20 = 0; lVar20 < pRVar4->edge_per; lVar20 = lVar20 + 1) {
                      pRVar3 = pRVar4->c2n;
                      lVar16 = (long)pRVar4->size_per * (long)local_80;
                      lVar18 = (long)(int)lVar16;
                      iVar1 = pRVar3[pRVar4->e2n[lVar20 * 2] + lVar18];
                      iVar2 = pRVar3[pRVar4->e2n[lVar20 * 2 + 1] + lVar18];
                      iVar7 = iVar2;
                      if (iVar1 < iVar2) {
                        iVar7 = iVar1;
                      }
                      iVar8 = iVar2;
                      if (iVar2 < iVar1) {
                        iVar8 = iVar1;
                      }
                      if ((RVar15 == iVar7) && ((int)local_60 == iVar8)) {
                        seg_nodes[1] = local_64;
                        seg_nodes[2] = pRVar3[lVar16 + 3];
                        seg_nodes[0] = iVar1;
                        uVar9 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
                        if (uVar9 != 0) {
                          pcVar19 = "tri side";
                          uVar14 = 0x5c9;
                          goto LAB_001a3ce0;
                        }
                        seg_nodes[0] = local_64;
                        seg_nodes[2] = pRVar4->c2n[(long)pRVar4->size_per * (long)local_80 + 3];
                        seg_nodes[1] = iVar2;
                        uVar9 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
                        if (uVar9 != 0) {
                          pcVar19 = "tri side";
                          uVar14 = 0x5cd;
                          goto LAB_001a3ce0;
                        }
                      }
                    }
                  }
                }
                pRVar12 = pRVar4->ref_adj->item;
                iVar1 = pRVar12[iVar13].next;
                local_80 = -1;
                iVar13 = iVar1;
              } while (iVar1 == -1);
            } while( true );
          }
        }
LAB_001a41d9:
        RVar11 = ref_cavity_verify_face_manifold(ref_cavity);
        if (RVar11 == 0) {
          RVar11 = ref_cavity_verify_seg_manifold(ref_cavity);
          if (RVar11 == 0) {
            return 0;
          }
          pcVar19 = "split seg manifold";
          uVar9 = 1;
          uVar14 = 0x5d5;
        }
        else {
          pcVar19 = "split face manifold";
          uVar9 = 1;
          uVar14 = 0x5d4;
        }
      }
      else {
        pcVar19 = "triangle side";
        uVar14 = 0x5a2;
      }
LAB_001a3ce0:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar14,"ref_cavity_form_edge_split",(ulong)uVar9,pcVar19);
      return uVar9;
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
LAB_001a3f84:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_split(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  REF_INT cell_edge, n0, n1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, new_node), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, new_node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->split_node0 = node0;
  ref_cavity->split_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        if (MIN(node0, node1) == MIN(n0, n1) &&
            MAX(node0, node1) == MAX(n0, n1)) {
          /* skip the edge to be split */
        } else {
          seg_nodes[0] = n0;
          seg_nodes[1] = n1;
          seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
          RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
        }
      }
    }
    RAS(1 == ref_list_n(ref_cavity_tri_list(ref_cavity)) ||
            2 == ref_list_n(ref_cavity_tri_list(ref_cavity)),
        "expect one or two tri");
    if (1 == ref_list_n(ref_cavity_tri_list(ref_cavity))) {
      each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node,
                                 cell) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          if (MIN(node0, node1) == MIN(n0, n1) &&
              MAX(node0, node1) == MAX(n0, n1)) {
            /* close topo with explicit edge split */
            seg_nodes[0] = n0;
            seg_nodes[1] = new_node;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
            seg_nodes[0] = new_node;
            seg_nodes[1] = n1;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
          }
        }
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "split face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "split seg manifold");

  return REF_SUCCESS;
}